

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O1

bool nite::isUpper(string *Input)

{
  ulong uVar1;
  char *pcVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  bool bVar6;
  
  uVar1 = Input->_M_string_length;
  bVar6 = uVar1 == 0;
  if (!bVar6) {
    pcVar2 = (Input->_M_dataplus)._M_p;
    iVar3 = isupper((int)*pcVar2);
    if (iVar3 != 0) {
      uVar4 = 1;
      do {
        uVar5 = (ulong)uVar4;
        bVar6 = uVar1 <= uVar5;
        if (uVar1 <= uVar5) {
          return bVar6;
        }
        iVar3 = isupper((int)pcVar2[uVar5]);
        uVar4 = uVar4 + 1;
      } while (iVar3 != 0);
    }
  }
  return bVar6;
}

Assistant:

bool nite::isUpper(const String &Input){
	for (unsigned i=0; i<Input.length(); i++){
		char c = Input.at(i);
		if (!isupper(c))
			return 0;
	}
	return 1;
}